

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void * google::CheckNotNull<void*>(char *file,int line,char *names,void **t)

{
  void **__s;
  string *str;
  allocator<char> local_41;
  CheckOpString local_40;
  LogMessageFatal local_38;
  void **local_28;
  void **t_local;
  char *names_local;
  char *pcStack_10;
  int line_local;
  char *file_local;
  
  if (*t == (void *)0x0) {
    local_28 = t;
    t_local = (void **)names;
    names_local._4_4_ = line;
    pcStack_10 = file;
    str = (string *)operator_new(0x20);
    __s = t_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)str,(char *)__s,&local_41);
    CheckOpString::CheckOpString(&local_40,str);
    LogMessageFatal::LogMessageFatal(&local_38,file,line,&local_40);
    LogMessageFatal::~LogMessageFatal(&local_38);
  }
  return *t;
}

Assistant:

T CheckNotNull(const char* file, int line, const char* names, T&& t) {
 if (t == nullptr) {
   LogMessageFatal(file, line, new std::string(names));
 }
 return std::forward<T>(t);
}